

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O0

string * __thiscall font2svg::glyph::points_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  byte bVar1;
  byte bVar2;
  FT_Pos FVar3;
  FT_Pos FVar4;
  FT_Pos FVar5;
  ostream *poVar6;
  string local_88 [8];
  string color;
  int radius;
  int ny;
  int nx;
  int y;
  int x;
  bool next_is_ctrl_pt;
  bool this_is_ctrl_pt;
  int i;
  allocator<char> local_39;
  string local_38 [32];
  glyph *local_18;
  glyph *this_local;
  
  local_18 = this;
  this_local = (glyph *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_39);
  std::__cxx11::stringstream::str((string *)&this->tmp);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::operator<<((ostream *)&this->field_0x270,"\n\n  <!-- draw points as circles -->");
  for (x = 0; x < (this->ftoutline).n_points; x = x + 1) {
    bVar1 = this->tags[x];
    bVar2 = this->tags[(x + 1) % (int)(this->ftoutline).n_points];
    FVar3 = this->ftpoints[x].x;
    FVar4 = this->ftpoints[x].y;
    FVar5 = this->ftpoints[(x + 1) % (int)(this->ftoutline).n_points].x;
    color.field_2._12_4_ = (undefined4)this->ftpoints[(x + 1) % (int)(this->ftoutline).n_points].y;
    color.field_2._8_4_ = 5;
    if (x == 0) {
      color.field_2._8_4_ = 10;
    }
    std::__cxx11::string::string(local_88);
    if ((bVar1 & 1) == 0) {
      std::__cxx11::string::operator=(local_88,"none");
      if ((bVar2 & 1) == 0) {
        std::operator<<((ostream *)&this->field_0x270,"\n  <!-- halfway pt between 2 ctrl pts -->");
        poVar6 = std::operator<<((ostream *)&this->field_0x270,"<circle");
        poVar6 = std::operator<<(poVar6," fill=\'");
        poVar6 = std::operator<<(poVar6,"blue");
        poVar6 = std::operator<<(poVar6,"\'");
        poVar6 = std::operator<<(poVar6," stroke=\'black\'");
        poVar6 = std::operator<<(poVar6," cx=\'");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,((int)FVar3 + (int)FVar5) / 2);
        poVar6 = std::operator<<(poVar6,"\' cy=\'");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,((int)FVar4 + color.field_2._12_4_) / 2)
        ;
        poVar6 = std::operator<<(poVar6,"\'");
        poVar6 = std::operator<<(poVar6," r=\'");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,2);
        poVar6 = std::operator<<(poVar6,"\'");
        std::operator<<(poVar6,"/>");
      }
    }
    else {
      std::__cxx11::string::operator=(local_88,"blue");
    }
    poVar6 = std::operator<<((ostream *)&this->field_0x270,"\n  <!--");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,x);
    std::operator<<(poVar6,"-->");
    poVar6 = std::operator<<((ostream *)&this->field_0x270,"<circle");
    poVar6 = std::operator<<(poVar6," fill=\'");
    poVar6 = std::operator<<(poVar6,local_88);
    poVar6 = std::operator<<(poVar6,"\'");
    poVar6 = std::operator<<(poVar6," stroke=\'black\'");
    poVar6 = std::operator<<(poVar6," cx=\'");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->ftpoints[x].x);
    poVar6 = std::operator<<(poVar6,"\' cy=\'");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->ftpoints[x].y);
    poVar6 = std::operator<<(poVar6,"\'");
    poVar6 = std::operator<<(poVar6," r=\'");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,color.field_2._8_4_);
    poVar6 = std::operator<<(poVar6,"\'");
    std::operator<<(poVar6,"/>");
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::stringstream::str();
  return __return_storage_ptr__;
}

Assistant:

std::string points()  {
		tmp.str("");
		tmp << "\n\n  <!-- draw points as circles -->";
		for ( int i = 0 ; i < ftoutline.n_points ; i++ ) {
			bool this_is_ctrl_pt = !(tags[i] & 1);
			bool next_is_ctrl_pt = !(tags[(i+1)%ftoutline.n_points] & 1);
			int x = ftpoints[i].x;
			int y = ftpoints[i].y;
			int nx = ftpoints[(i+1)%ftoutline.n_points].x;
			int ny = ftpoints[(i+1)%ftoutline.n_points].y;
			int radius = 5;
			if ( i == 0 ) radius = 10;
			std::string color;
			if (this_is_ctrl_pt) color = "none"; else color = "blue";
			if (this_is_ctrl_pt && next_is_ctrl_pt) {
				tmp << "\n  <!-- halfway pt between 2 ctrl pts -->";
				tmp << "<circle"
				  << " fill='" << "blue" << "'"
				  << " stroke='black'"
				  << " cx='" << (x+nx)/2 << "' cy='" << (y+ny)/2 << "'"
				  << " r='" << 2 << "'"
				  << "/>";
			};
			tmp << "\n  <!--" << i << "-->";
			tmp << "<circle"
				<< " fill='" << color << "'"
				<< " stroke='black'"
				<< " cx='" << ftpoints[i].x << "' cy='" << ftpoints[i].y << "'"
				<< " r='" << radius << "'"
				<< "/>";
		}

		return tmp.str();
	}